

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charfreqs.cpp
# Opt level: O0

void handle_a_sequence_aa
               (StringBuffer *current_sequence,double *resolutions,long firstSequenceLength,
               long instance_count,bool ignore_ambigs)

{
  char *pcVar1;
  long *plVar2;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  StringBuffer *in_RDI;
  byte in_R8B;
  long k;
  long *res;
  long c;
  double local_instance_count;
  uchar *s;
  long resolution_index;
  long local_58;
  long local_48;
  double local_40;
  long local_30;
  
  local_30 = 0;
  pcVar1 = StringBuffer::getString(in_RDI);
  local_40 = (double)in_RCX;
  for (local_48 = 0; local_48 < in_RDX; local_48 = local_48 + 1) {
    plVar2 = resolve_char(pcVar1[local_48],true,(bool)(in_R8B & 1));
    if ((bool)(in_R8B & 1) == false) {
      local_40 = resolution_count(pcVar1[local_48],true);
      local_40 = (double)in_RCX * local_40;
    }
    for (local_58 = 0; local_58 < 0x14; local_58 = local_58 + 1) {
      *(double *)(in_RSI + (local_30 + local_58) * 8) =
           local_40 * (double)plVar2[local_58] + *(double *)(in_RSI + (local_30 + local_58) * 8);
    }
    local_30 = local_30 + 0x14;
  }
  return;
}

Assistant:

void handle_a_sequence_aa (StringBuffer& current_sequence, double * resolutions, const long firstSequenceLength, long instance_count, bool ignore_ambigs) {
    long resolution_index = 0;
    const unsigned char *s = (const unsigned char *)current_sequence.getString();
    double local_instance_count = instance_count;
    for (long c = 0; c < firstSequenceLength; c++, resolution_index+=20) {
        const long * res = resolve_char(s[c], true, ignore_ambigs);
        if (ignore_ambigs == false) {
          local_instance_count = instance_count * resolution_count(s[c], true);
        }
        for (long k = 0; k < 20; k++) {
          resolutions [resolution_index + k]   += local_instance_count*res[k];
        }
    }
}